

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2coords.h
# Opt level: O1

void S2::ValidFaceXYZtoUV(int face,S2Point *p,double *pu,double *pv)

{
  long lVar1;
  VType *pVVar2;
  VType VVar3;
  S2LogMessage SStack_18;
  
  lVar1 = (long)face;
  if (*(double *)(internal::kFaceUVWAxes + lVar1 * 0x48 + 0x40) * p->c_[2] +
      *(double *)(internal::kFaceUVWAxes + lVar1 * 0x48 + 0x38) * p->c_[1] +
      *(double *)(internal::kFaceUVWAxes + lVar1 * 0x48 + 0x30) * p->c_[0] + 0.0 <= 0.0) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2coords.h"
               ,0x16d,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (p.DotProd(GetNorm(face))) > (0) ",0x2f);
    abort();
  }
  if ((uint)face < 5) {
    pVVar2 = p->c_ + 1;
    switch(face) {
    case 0:
      *pu = p->c_[1] / p->c_[0];
      VVar3 = p->c_[2];
      pVVar2 = p->c_;
      break;
    case 1:
      *pu = -p->c_[0] / p->c_[1];
      VVar3 = p->c_[2];
      break;
    case 2:
      *pu = -p->c_[0] / p->c_[2];
      VVar3 = p->c_[1];
      goto LAB_00197e7a;
    case 3:
      *pu = p->c_[2] / p->c_[0];
      VVar3 = p->c_[1];
      pVVar2 = p->c_;
      break;
    case 4:
      *pu = p->c_[2] / p->c_[1];
      VVar3 = -p->c_[0];
    }
  }
  else {
    *pu = -p->c_[1] / p->c_[2];
    VVar3 = p->c_[0];
LAB_00197e7a:
    VVar3 = -VVar3;
    pVVar2 = p->c_ + 2;
  }
  *pv = VVar3 / *pVVar2;
  return;
}

Assistant:

inline S2Point GetUVWAxis(int face, int axis) {
  const double* p = internal::kFaceUVWAxes[face][axis];
  return S2Point(p[0], p[1], p[2]);
}